

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMaxUp
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *param_3,bool updateOverlaps)

{
  Handle *pHVar1;
  Handle *pHVar2;
  short *psVar3;
  ushort uVar4;
  Handle *pHVar5;
  cbtOverlappingPairCallback *pcVar6;
  ushort uVar7;
  ulong uVar8;
  Edge EVar9;
  undefined6 in_register_00000012;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Edge *pEVar13;
  long lVar14;
  bool bVar15;
  
  lVar14 = (long)axis;
  uVar8 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar7 = this->m_pEdges[lVar14][uVar8 + 1].m_handle;
  if (uVar7 != 0) {
    pEVar13 = this->m_pEdges[lVar14] + uVar8;
    uVar4 = pEVar13->m_handle;
    uVar11 = 1 << (axis & 0x1fU) & 3;
    pHVar5 = this->m_pHandles;
    EVar9.m_handle = 0;
    EVar9.m_pos = pEVar13->m_pos;
    uVar12 = 1 << uVar11 & 3;
    do {
      if (EVar9.m_pos < pEVar13[1].m_pos) {
        return;
      }
      bVar15 = (pEVar13[1].m_pos & 1) == 0;
      lVar10 = 0x3a;
      if (bVar15) {
        lVar10 = 0x34;
      }
      pHVar1 = this->m_pHandles + uVar7;
      if ((((bVar15 && updateOverlaps) &&
           (lVar10 = 0x34,
           *(ushort *)
            ((long)(&(pHVar1->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar11 * 2)) <=
           *(ushort *)((long)pHVar5->m_maxEdges + (ulong)(uVar11 * 2) + (ulong)((uint)uVar4 * 0x48))
           )) && (*(ushort *)
                   ((long)(&(pHVar5->super_cbtBroadphaseProxy).m_aabbMax + 1) +
                   (ulong)(uVar11 * 2) + (ulong)((uint)uVar4 * 0x48)) <=
                  *(ushort *)((long)pHVar1->m_maxEdges + (ulong)(uVar11 * 2)))) &&
         ((uVar8 = (ulong)(uVar12 * 2),
          *(ushort *)((long)(&(pHVar1->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar8) <=
          *(ushort *)((long)pHVar5->m_maxEdges + uVar8 + (uint)uVar4 * 0x48) &&
          (uVar8 = (ulong)(uVar12 * 2),
          *(ushort *)
           ((long)(&(pHVar5->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar8 + (uint)uVar4 * 0x48)
          <= *(ushort *)((long)pHVar1->m_maxEdges + uVar8))))) {
        pHVar2 = this->m_pHandles + pEVar13->m_handle;
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar2,pHVar1);
        pcVar6 = this->m_userPairCallback;
        if (pcVar6 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar6->_vptr_cbtOverlappingPairCallback[2])(pcVar6,pHVar2,pHVar1);
        }
      }
      psVar3 = (short *)((long)(pHVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                        lVar14 * 2 + lVar10 + -0x14);
      *psVar3 = *psVar3 + -1;
      psVar3 = (short *)((long)pHVar5->m_maxEdges + lVar14 * 2 + (ulong)((uint)uVar4 * 0x48));
      *psVar3 = *psVar3 + 1;
      EVar9 = *pEVar13;
      *pEVar13 = pEVar13[1];
      pEVar13[1] = EVar9;
      uVar7 = pEVar13[2].m_handle;
      pEVar13 = pEVar13 + 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1 << axis) & 3;
		const int axis2 = (1 << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext, axis1, axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0, handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0, handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
}